

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::Material>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Material *material,string *prop_name,Property *out_prop)

{
  bool bVar1;
  ListEditQual LVar2;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *pvVar3;
  AttrMeta *pAVar4;
  AttrMeta *pAVar5;
  pointer_conflict ppVar6;
  bool local_1a52;
  bool local_1a51;
  _Self local_1a50;
  _Self local_1a48;
  const_iterator it;
  Property local_1a38;
  string local_1458;
  undefined1 local_1438 [8];
  Attribute attr_2;
  Property local_1188;
  string local_ba8;
  undefined1 local_b88 [8];
  Attribute attr_1;
  Property local_8d8;
  string local_2f8;
  undefined1 local_2d8 [8];
  Attribute attr;
  Property *out_prop_local;
  string *prop_name_local;
  Material *material_local;
  
  if (out_prop == (Property *)0x0) {
    attr._metas.stringData.
    super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)nonstd::expected_lite::make_unexpected<char_const(&)[59]>
                            ((char (*) [59])
                             "[InternalError] nullptr in output Property is not allowed.");
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>
              (__return_storage_ptr__,
               (unexpected_type<const_char_*> *)
               &attr._metas.stringData.
                super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              prop_name,"outputs:surface");
    if (bVar1) {
      bVar1 = TypedConnection<tinyusdz::Token>::authored(&material->surface);
      if (!bVar1) {
        attr_1._metas.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<bool,_0>(__return_storage_ptr__,
                            (bool *)((long)&attr_1._metas.stringData.
                                            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7))
        ;
        return __return_storage_ptr__;
      }
      Attribute::Attribute((Attribute *)local_2d8);
      tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
      Attribute::set_type_name((Attribute *)local_2d8,&local_2f8);
      ::std::__cxx11::string::~string((string *)&local_2f8);
      pvVar3 = TypedConnection<tinyusdz::Token>::get_connections(&material->surface);
      Attribute::set_connections((Attribute *)local_2d8,pvVar3);
      pAVar4 = TypedConnection<tinyusdz::Token>::metas(&material->surface);
      pAVar5 = Attribute::metas((Attribute *)local_2d8);
      AttrMetas::operator=(pAVar5,pAVar4);
      Property::Property(&local_8d8,(Attribute *)local_2d8,false);
      Property::operator=(out_prop,&local_8d8);
      Property::~Property(&local_8d8);
      LVar2 = TypedConnection<tinyusdz::Token>::get_listedit_qual(&material->surface);
      Property::set_listedit_qual(out_prop,LVar2);
      Attribute::~Attribute((Attribute *)local_2d8);
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )prop_name,"outputs:displacement");
      if (bVar1) {
        bVar1 = TypedConnection<tinyusdz::Token>::authored(&material->displacement);
        if (!bVar1) {
          attr_2._metas.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::expected<bool,_0>(__return_storage_ptr__,
                              (bool *)((long)&attr_2._metas.stringData.
                                              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 7
                                      ));
          return __return_storage_ptr__;
        }
        Attribute::Attribute((Attribute *)local_b88);
        tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
        Attribute::set_type_name((Attribute *)local_b88,&local_ba8);
        ::std::__cxx11::string::~string((string *)&local_ba8);
        pvVar3 = TypedConnection<tinyusdz::Token>::get_connections(&material->displacement);
        Attribute::set_connections((Attribute *)local_b88,pvVar3);
        pAVar4 = TypedConnection<tinyusdz::Token>::metas(&material->displacement);
        pAVar5 = Attribute::metas((Attribute *)local_b88);
        AttrMetas::operator=(pAVar5,pAVar4);
        Property::Property(&local_1188,(Attribute *)local_b88,false);
        Property::operator=(out_prop,&local_1188);
        Property::~Property(&local_1188);
        LVar2 = TypedConnection<tinyusdz::Token>::get_listedit_qual(&material->displacement);
        Property::set_listedit_qual(out_prop,LVar2);
        Attribute::~Attribute((Attribute *)local_b88);
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)prop_name,"outputs:volume");
        if (bVar1) {
          bVar1 = TypedConnection<tinyusdz::Token>::authored(&material->volume);
          if (!bVar1) {
            it._M_node._7_1_ = 0;
            nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::expected<bool,_0>(__return_storage_ptr__,(bool *)((long)&it._M_node + 7));
            return __return_storage_ptr__;
          }
          Attribute::Attribute((Attribute *)local_1438);
          tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
          Attribute::set_type_name((Attribute *)local_1438,&local_1458);
          ::std::__cxx11::string::~string((string *)&local_1458);
          pvVar3 = TypedConnection<tinyusdz::Token>::get_connections(&material->volume);
          Attribute::set_connections((Attribute *)local_1438,pvVar3);
          pAVar4 = TypedConnection<tinyusdz::Token>::metas(&material->volume);
          pAVar5 = Attribute::metas((Attribute *)local_1438);
          AttrMetas::operator=(pAVar5,pAVar4);
          Property::Property(&local_1a38,(Attribute *)local_1438,false);
          Property::operator=(out_prop,&local_1a38);
          Property::~Property(&local_1a38);
          LVar2 = TypedConnection<tinyusdz::Token>::get_listedit_qual(&material->volume);
          Property::set_listedit_qual(out_prop,LVar2);
          Attribute::~Attribute((Attribute *)local_1438);
        }
        else {
          local_1a48._M_node =
               (_Base_ptr)
               ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::find(&(material->super_UsdShadePrim).props,prop_name);
          local_1a50._M_node =
               (_Base_ptr)
               ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::end(&(material->super_UsdShadePrim).props);
          bVar1 = ::std::operator==(&local_1a48,&local_1a50);
          if (bVar1) {
            local_1a51 = false;
            nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::expected<bool,_0>(__return_storage_ptr__,&local_1a51);
            return __return_storage_ptr__;
          }
          ppVar6 = ::std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
                   ::operator->(&local_1a48);
          Property::operator=(out_prop,&ppVar6->second);
        }
      }
    }
    local_1a52 = true;
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<bool,_0>(__return_storage_ptr__,&local_1a52);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const Material &material, const std::string &prop_name,
    Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  DCOUT("prop_name = " << prop_name);
  if (prop_name == "outputs:surface") {
    if (material.surface.authored()) {
      Attribute attr;
      attr.set_type_name(value::TypeTraits<value::token>::type_name());
      attr.set_connections(material.surface.get_connections());
      attr.metas() = material.surface.metas();
      (*out_prop) = Property(attr, /* custom */ false);
      out_prop->set_listedit_qual(material.surface.get_listedit_qual());
    } else {
      // Not authored
      return false;
    }
  } else if (prop_name == "outputs:displacement") {
    if (material.displacement.authored()) {
      Attribute attr;
      attr.set_type_name(value::TypeTraits<value::token>::type_name());
      attr.set_connections(material.displacement.get_connections());
      attr.metas() = material.displacement.metas();
      (*out_prop) = Property(attr, /* custom */ false);
      out_prop->set_listedit_qual(material.displacement.get_listedit_qual());
    } else {
      // Not authored
      return false;
    }
  } else if (prop_name == "outputs:volume") {
    if (material.volume.authored()) {
      Attribute attr;
      attr.set_type_name(value::TypeTraits<value::token>::type_name());
      attr.set_connections(material.volume.get_connections());
      attr.metas() = material.volume.metas();
      (*out_prop) = Property(attr, /* custom */ false);
      out_prop->set_listedit_qual(material.volume.get_listedit_qual());
    } else {
      // Not authored
      return false;
    }
  } else {
    const auto it = material.props.find(prop_name);
    if (it == material.props.end()) {
      // Attribute not found.
      return false;
    }

    (*out_prop) = it->second;
  }

  DCOUT("Prop found: " << prop_name
                       << ", ty = " << out_prop->value_type_name());
  return true;
}